

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput
helicsFederateRegisterSubscription(HelicsFederate fed,char *key,char *units,HelicsError *err)

{
  bool bVar1;
  Input *pIVar2;
  pointer pIVar3;
  long in_RDX;
  long in_RSI;
  ValueFederate *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  string_view in_stack_00000028;
  __single_object sub;
  shared_ptr<helics::ValueFederate> fedObj;
  shared_ptr<helics::ValueFederate> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  shared_ptr<helics::ValueFederate> *this;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *this_00;
  HelicsFederate in_stack_ffffffffffffff68;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> local_80;
  __sv_type local_78;
  __sv_type local_68;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
  *in_stack_ffffffffffffffa8;
  HelicsFederate in_stack_ffffffffffffffb0;
  shared_ptr<helics::ValueFederate> local_48;
  __shared_ptr local_38 [24];
  long local_20;
  long local_18;
  HelicsInput local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getValueFedSharedPtr(in_stack_ffffffffffffff68,(HelicsError *)in_stack_ffffffffffffff60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    std::make_unique<helics::InputObject>();
    std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1cb3f7);
    if (local_18 == 0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if (local_20 == 0) {
      local_78 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    pIVar2 = helics::ValueFederate::registerSubscription
                       (in_stack_00000010,in_stack_00000028,(string_view)in_stack_00000018);
    this = &local_48;
    pIVar3 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::
             operator->((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                         *)0x1cb49a);
    pIVar3->inputPtr = pIVar2;
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::operator->
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               0x1cb4ad);
    std::shared_ptr<helics::ValueFederate>::operator=(this,in_stack_ffffffffffffff48);
    this_00 = &local_80;
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)this,
               (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               in_stack_ffffffffffffff48);
    local_8 = anon_unknown.dwarf_5d1c2::addInput
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (this_00);
    local_48.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = 1;
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (this_00);
  }
  else {
    local_8 = (HelicsInput)0x0;
    local_48.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = 1;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cb5c8)
  ;
  return local_8;
}

Assistant:

HelicsInput helicsFederateRegisterSubscription(HelicsFederate fed, const char* key, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto sub = std::make_unique<helics::InputObject>();
        sub->inputPtr = &fedObj->registerSubscription(AS_STRING_VIEW(key), AS_STRING_VIEW(units));
        sub->fedptr = std::move(fedObj);
        return addInput(fed, std::move(sub));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
    // LCOV_EXCL_STOP
}